

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

bool __thiscall
kj::ArrayPtr<const_unsigned_int>::operator==
          (ArrayPtr<const_unsigned_int> *this,ArrayPtr<const_unsigned_int> *other)

{
  size_t sVar1;
  int iVar2;
  
  sVar1 = this->size_;
  if (sVar1 != other->size_) {
    return false;
  }
  if (sVar1 != 0) {
    iVar2 = bcmp(this->ptr,other->ptr,sVar1 << 2);
    return iVar2 == 0;
  }
  return true;
}

Assistant:

inline constexpr bool operator==(const ArrayPtr& other) const {
    if (size_ != other.size_) return false;
#if KJ_HAS_COMPILER_FEATURE(cxx_constexpr_string_builtins)
    if (isIntegral<RemoveConst<T>>()) {
      if (size_ == 0) return true;
      return __builtin_memcmp(ptr, other.ptr, size_ * sizeof(T)) == 0;
    }
#endif
    for (size_t i = 0; i < size_; i++) {
      if (ptr[i] != other[i]) return false;
    }
    return true;
  }